

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quad.cpp
# Opt level: O0

float * __thiscall Quad::toVertices(Quad *this,float scale)

{
  float *pfVar1;
  Vec2d *this_00;
  float fVar2;
  Vec2d *rotatedCoord;
  int i;
  float *floatVertices;
  float scale_local;
  Quad *this_local;
  
  pfVar1 = (float *)operator_new__(0x20);
  for (rotatedCoord._4_4_ = 0; rotatedCoord._4_4_ < 8; rotatedCoord._4_4_ = rotatedCoord._4_4_ + 2)
  {
    this_00 = Vec2d::getScale(this->vertices[rotatedCoord._4_4_ / 2],scale);
    fVar2 = Vec2d::getX(this_00);
    pfVar1[rotatedCoord._4_4_] = fVar2;
    fVar2 = Vec2d::getY(this_00);
    pfVar1[rotatedCoord._4_4_ + 1] = fVar2;
    if (this_00 != (Vec2d *)0x0) {
      operator_delete(this_00);
    }
  }
  return pfVar1;
}

Assistant:

float* Quad::toVertices(float scale) {
    float* floatVertices = new float[8];
    
    for (int i=0; i < 8; i+=2) {
        Vec2d* rotatedCoord = vertices[i/2]->getScale(scale);
        
        floatVertices[i]   = rotatedCoord->getX();
        floatVertices[i+1] = rotatedCoord->getY();
        
        delete rotatedCoord;
        rotatedCoord = nullptr;
    }
    
    return floatVertices;
}